

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::receiveIncomingMessage
          (ConnectionImpl *this)

{
  int *piVar1;
  long *plVar2;
  undefined8 *puVar3;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *pIVar4;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX_00;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX_01;
  ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *extraout_RDX_02;
  long in_RSI;
  IncomingRpcMessage *pIVar5;
  Disposer *pDVar6;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_> OVar7;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> PVar8;
  PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> paf;
  Maybe<kj::Own<capnp::IncomingRpcMessage>_> local_1b8;
  Maybe<kj::Own<capnp::IncomingRpcMessage>_> local_1a8;
  Disposer *local_198;
  IncomingRpcMessage *pIStack_190;
  _func_int **local_188;
  _func_int **pp_Stack_180;
  undefined1 local_178 [24];
  long *local_160;
  
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    kj::Exception::Exception((Exception *)local_178,(Exception *)(in_RSI + 0x40));
    kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>
              ((kj *)&local_188,(Exception *)local_178);
    (this->super_Connection).super_Connection._vptr_Connection = local_188;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Stack_180;
    kj::Exception::~Exception((Exception *)local_178);
    pIVar4 = extraout_RDX;
    goto LAB_002dcdc3;
  }
  plVar2 = *(long **)(in_RSI + 0x1f8);
  if (*(long **)(in_RSI + 0x218) == plVar2) {
    puVar3 = *(undefined8 **)(in_RSI + 0x240);
    if (puVar3 == (undefined8 *)0x0) {
      kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>();
      std::
      deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>,std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>>
      ::emplace_back<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>
                ((deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>,std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>>
                  *)(in_RSI + 0x198),
                 (Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_> *)
                 (local_178 + 0x10));
      plVar2 = local_160;
      *(undefined4 *)&(this->super_Connection).super_Connection._vptr_Connection = local_178._0_4_;
      *(undefined4 *)((long)&(this->super_Connection).super_Connection._vptr_Connection + 4) =
           local_178._4_4_;
      *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = local_178._8_4_;
      *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
           local_178._12_4_;
      local_178._8_8_ = (IncomingRpcMessage *)0x0;
      pIVar4 = extraout_RDX_00;
      if (local_160 == (long *)0x0) goto LAB_002dcdc3;
      local_160 = (long *)0x0;
      (***(_func_int ***)local_178._16_8_)
                (local_178._16_8_,*(long *)(*plVar2 + -0x10) + (long)plVar2);
      pIVar5 = (IncomingRpcMessage *)local_178._8_8_;
      pIVar4 = extraout_RDX_01;
      if ((IncomingRpcMessage *)local_178._8_8_ == (IncomingRpcMessage *)0x0) goto LAB_002dcdc3;
      local_178._8_8_ = (_func_int **)0x0;
      pDVar6 = (Disposer *)CONCAT44(local_178._4_4_,local_178._0_4_);
    }
    else {
      (**(code **)*puVar3)(puVar3,local_178);
      local_1a8.ptr.disposer = (Disposer *)0x0;
      local_1a8.ptr.ptr = (IncomingRpcMessage *)0x0;
      OVar7 = kj::
              heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>
                        ((kj *)local_178,&local_1a8);
      pIVar5 = local_1a8.ptr.ptr;
      pIVar4 = OVar7.ptr;
      (this->super_Connection).super_Connection._vptr_Connection =
           (_func_int **)CONCAT44(local_178._4_4_,local_178._0_4_);
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_178._8_8_;
      if (local_1a8.ptr.ptr == (IncomingRpcMessage *)0x0) goto LAB_002dcdc3;
      local_1a8.ptr.ptr = (IncomingRpcMessage *)0x0;
      pDVar6 = local_1a8.ptr.disposer;
    }
  }
  else {
    piVar1 = (int *)(*(long *)(in_RSI + 0x20) + 0x14);
    *piVar1 = *piVar1 + 1;
    local_198 = (Disposer *)*plVar2;
    pIStack_190 = (IncomingRpcMessage *)plVar2[1];
    plVar2[1] = 0;
    std::
    deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>
    ::pop_front((deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>
                 *)(in_RSI + 0x1e8));
    local_1b8.ptr.disposer = local_198;
    local_1b8.ptr.ptr = pIStack_190;
    OVar7 = kj::
            heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>
                      ((kj *)local_178,&local_1b8);
    pIVar5 = local_1b8.ptr.ptr;
    pIVar4 = OVar7.ptr;
    (this->super_Connection).super_Connection._vptr_Connection =
         (_func_int **)CONCAT44(local_178._4_4_,local_178._0_4_);
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_178._8_8_;
    if (local_1b8.ptr.ptr == (IncomingRpcMessage *)0x0) goto LAB_002dcdc3;
    local_1b8.ptr.ptr = (IncomingRpcMessage *)0x0;
    pDVar6 = local_1b8.ptr.disposer;
  }
  (**pDVar6->_vptr_Disposer)
            (pDVar6,pIVar5->_vptr_IncomingRpcMessage[-2] + (long)&pIVar5->_vptr_IncomingRpcMessage);
  pIVar4 = extraout_RDX_02;
LAB_002dcdc3:
  PVar8.super_PromiseBase.node.ptr = (PromiseNode *)pIVar4;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> receiveIncomingMessage() override {
      KJ_IF_MAYBE(e, networkException) {
        return kj::cp(*e);
      }

      if (messages.empty()) {
        KJ_IF_MAYBE(f, fulfillOnEnd) {
          f->get()->fulfill();
          return kj::Maybe<kj::Own<IncomingRpcMessage>>(nullptr);
        } else {
          auto paf = kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<IncomingRpcMessage>>>();
          fulfillers.push(kj::mv(paf.fulfiller));
          return kj::mv(paf.promise);
        }
      }